

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O2

void injection::InjectionManager::bind_singleton<ITest,Test1>(void)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = injection_private::simple_maker<Test1>;
  local_10 = std::_Function_handler<ITest_*(),_Test1_*(*)()>::_M_invoke;
  local_18 = std::_Function_handler<ITest_*(),_Test1_*(*)()>::_M_manager;
  bind<ITest>((function<ITest_*()> *)local_28,SINGLETON);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

static void bind_singleton() {
        bind<I>(injection_private::simple_maker<C>, InjectionScope::SINGLETON);
    }